

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

unsigned_short ot::commissioner::utils::Decode<unsigned_short>(uint8_t *aBuf,size_t aLength)

{
  size_t i;
  long lVar1;
  ushort uVar2;
  
  if (1 < aLength) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = (ushort)aBuf[lVar1] | uVar2 << 8;
      lVar1 = lVar1 + 1;
    } while (lVar1 == 1);
    return uVar2;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils.hpp"
                ,0xa2,
                "T ot::commissioner::utils::Decode(const uint8_t *, size_t) [T = unsigned short]");
}

Assistant:

T Decode(const uint8_t *aBuf, size_t aLength)
{
    T ret = 0;

    ASSERT(aLength >= sizeof(T));

    for (size_t i = 0; i < sizeof(T); ++i)
    {
        ret = (ret << 8) | aBuf[i];
    }
    return ret;
}